

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

Wrench * iDynTree::computeKnownTermsOfEstimationEquationWithInternalFT
                   (Wrench *__return_storage_ptr__,Model *model,Traversal *subModelTraversal,
                   SensorsList *sensors,JointPosDoubleArray *jointPos,LinkVelArray *linkVel,
                   LinkAccArray *linkProperAcc,SensorsMeasurements *ftSensorsMeasurements,
                   estimateExternalWrenchesBuffers *bufs)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long link_id;
  long lVar5;
  Twist *pTVar6;
  SpatialMomentum *pSVar7;
  Wrench *pWVar8;
  long lVar9;
  long *plVar10;
  Transform *pTVar11;
  LinkWrenches *this;
  uint uVar12;
  Transform visitedLink_X_child;
  Wrench local_1a8;
  Wrench local_170;
  Wrench local_138;
  Wrench local_d8;
  SpatialInertia local_a0 [56];
  Twist local_68 [56];
  
  iVar2 = iDynTree::Traversal::getNrOfVisitedLinks();
  this = &bufs->b_contacts_subtree;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) {
      local_138._0_8_ = iDynTree::Wrench::operator+;
      local_138._8_8_ = 0;
      local_138._16_8_ = 0;
      local_138._24_8_ = 0;
      local_138._32_8_ = 0;
      local_138._40_8_ = 0;
      local_138._48_8_ = 0;
      iDynTree::Wrench::Wrench(__return_storage_ptr__,&local_138.super_SpatialForceVector);
      iDynTree::SpatialForceVector::~SpatialForceVector(&local_138.super_SpatialForceVector);
      return __return_storage_ptr__;
    }
    iDynTree::Traversal::getLink((long)subModelTraversal);
    link_id = iDynTree::Link::getIndex();
    lVar5 = iDynTree::Traversal::getParentLink((long)subModelTraversal);
    pTVar6 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(linkProperAcc,link_id);
    pSVar7 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(linkVel,link_id);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_1a8,(SpatialAcc *)pTVar6);
    iDynTree::SpatialInertia::operator*(local_a0,pTVar6);
    iDynTree::Twist::operator*(local_68,pSVar7);
    iDynTree::Wrench::operator+(&local_170,&local_1a8);
    getMeasuredWrench(&local_d8,sensors,ftSensorsMeasurements,link_id);
    iDynTree::Wrench::operator-(&local_138,&local_170);
    pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
    iDynTree::Wrench::operator=(pWVar8,(Wrench *)&local_138.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_138.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_d8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_170.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_a0);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_1a8.super_SpatialForceVector);
    iVar3 = iDynTree::Model::getNrOfNeighbors((long)model);
    if (iVar3 != 0) {
      uVar12 = 0;
      do {
        lVar9 = iDynTree::Model::getNeighbor((long)model,(uint)link_id);
        cVar1 = iDynTree::Traversal::isParentOf((long)subModelTraversal,link_id);
        if (cVar1 != '\0') {
          iDynTree::Model::getNeighbor((long)model,(uint)link_id);
          plVar10 = (long *)iDynTree::Model::getJoint((long)model);
          pTVar11 = (Transform *)(**(code **)(*plVar10 + 0x50))(plVar10,jointPos,link_id,lVar9);
          iDynTree::Transform::Transform((Transform *)&local_138,pTVar11);
          pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
          iDynTree::LinkWrenches::operator()(this,lVar9);
          iDynTree::Transform::operator*((Transform *)&local_1a8,&local_138);
          iDynTree::Wrench::operator+(&local_170,pWVar8);
          pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
          iDynTree::Wrench::operator=(pWVar8,(Wrench *)&local_170.super_SpatialForceVector);
          iDynTree::SpatialForceVector::~SpatialForceVector(&local_170.super_SpatialForceVector);
          iDynTree::SpatialForceVector::~SpatialForceVector(&local_1a8.super_SpatialForceVector);
        }
        uVar12 = uVar12 + 1;
        uVar4 = iDynTree::Model::getNrOfNeighbors((long)model);
      } while (uVar12 < uVar4);
    }
  } while (lVar5 != 0);
  pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
  iDynTree::Wrench::Wrench(__return_storage_ptr__,pWVar8);
  return __return_storage_ptr__;
}

Assistant:

Wrench computeKnownTermsOfEstimationEquationWithInternalFT(const Model& model,
                                                           const Traversal& subModelTraversal,
                                                           const SensorsList& sensors,
                                                           const JointPosDoubleArray & jointPos,
                                                           const LinkVelArray& linkVel,
                                                           const LinkAccArray& linkProperAcc,
                                                           const SensorsMeasurements& ftSensorsMeasurements,
                                                                 estimateExternalWrenchesBuffers& bufs)
{
    // First compute the known term of the estimation for each link:
    // this loop is similar to the dynamic phase of the RNEA
    // \todo pimp up performance as done in RNEADynamicPhase
     for(int traversalEl = subModelTraversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
     {
         LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
         LinkIndex    visitedLinkIndex = visitedLink->getIndex();
         LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         bufs.b_contacts_subtree(visitedLinkIndex) = I*properAcc + v*(I*v) - getMeasuredWrench(sensors,ftSensorsMeasurements,visitedLinkIndex);

         // Iterate on childs of visitedLink
         // We obtain all the children as all the neighbors of the link, except
         // for its parent
         // \todo TODO this point is definitly Tree-specific
         // \todo TODO this "get child" for is duplicated in the code, we
         //            should try to consolidate it
         for(unsigned int neigh_i=0; neigh_i < model.getNrOfNeighbors(visitedLinkIndex); neigh_i++)
         {
             LinkIndex neighborIndex = model.getNeighbor(visitedLinkIndex,neigh_i).neighborLink;
             // Check if this neighbor is a child of the link according to this traversal
             if( subModelTraversal.isParentOf(visitedLinkIndex,neighborIndex) )
             {
                 LinkIndex childIndex = neighborIndex;
                 IJointConstPtr neighborJoint = model.getJoint(model.getNeighbor(visitedLinkIndex,neigh_i).neighborJoint);
                 Transform visitedLink_X_child = neighborJoint->getTransform(jointPos,visitedLinkIndex,childIndex);

                 // One term of the sum in Equation 5.20 in Featherstone 2008
                 bufs.b_contacts_subtree(visitedLinkIndex) = bufs.b_contacts_subtree(visitedLinkIndex)
                                                            + visitedLink_X_child*bufs.b_contacts_subtree(childIndex);
             }
         }

         if( parentLink == 0 )
         {
             // If the visited link is the base of the submodel, the
             // computed known terms is the known term of the submodel itself
             return bufs.b_contacts_subtree(visitedLinkIndex);
         }
     }

     // If we reach this point of the code, something is really really wrong
     assert(false);
     return Wrench::Zero();
}